

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module,DAEFunctionInfoMap *infoMap)

{
  _Base_ptr *calls;
  _Rb_tree_node_base *__k;
  __node_base_ptr *__k_00;
  __node_base_ptr *__dest;
  Index x;
  _Hash_node_base *p_Var1;
  pointer puVar2;
  Export *pEVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  __node_base _Var9;
  __node_base _Var10;
  bool bVar11;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *pvVar12;
  mapped_type *pmVar13;
  mapped_type *pppEVar14;
  size_type sVar15;
  Function *pFVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  size_t sVar19;
  iterator iVar20;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_> _Var21
  ;
  _Hash_node_base *p_Var22;
  __node_base_ptr p_Var23;
  variant<wasm::Name,_wasm::HeapType> *pvVar24;
  _Hash_node_base *p_Var25;
  size_t *this_00;
  pointer puVar26;
  uint uVar27;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  __node_base _Var28;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar29;
  _Base_ptr p_Var30;
  DAE *pDVar31;
  Signature SVar32;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  undefined1 local_4e8 [8];
  DAEScanner scanner;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  callTargetsToLocalize;
  SortedVector optimizedIndexes;
  void *local_230;
  long local_220;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_208;
  undefined1 local_1d0 [8];
  unordered_map<wasm::Expression_*,_wasm::Name,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>_>
  expressionFuncs;
  undefined1 local_170 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  hasUnseenCalls;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  worthOptimizing;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  long local_c0;
  Function *local_b8;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_b0;
  undefined1 auStack_a8 [8];
  Name name;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_88;
  _Base_ptr local_68;
  _Hash_node_base *local_60;
  DAE *local_58;
  __node_base local_50;
  anon_class_8_1_f74e94ae markStale;
  Function *func;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_68 = (_Base_ptr)&this->allDroppedCalls;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_68);
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_4e8 = (undefined1  [8])&PTR__WalkerPass_01091d20;
  scanner.infoMap = (DAEFunctionInfoMap *)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currModule =
       (Module *)infoMap;
  local_b0 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)infoMap;
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.passArg.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             + 0x20),module);
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)local_4e8,(this->super_Pass).runner,module);
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&allCalls;
  allCalls._M_t._M_impl._0_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  scanner.info = (DAEFunctionInfo *)&tailCallees._M_h._M_rehash_policy._M_next_resize;
  tailCallees._M_h._M_buckets = (__buckets_ptr)0x1;
  tailCallees._M_h._M_bucket_count = 0;
  tailCallees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tailCallees._M_h._M_element_count._0_4_ = 0x3f800000;
  tailCallees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tailCallees._M_h._M_rehash_policy._4_4_ = 0;
  tailCallees._M_h._M_rehash_policy._M_next_resize = 0;
  local_170 = (undefined1  [8])&hasUnseenCalls._M_h._M_rehash_policy._M_next_resize;
  hasUnseenCalls._M_h._M_buckets = (__buckets_ptr)0x1;
  hasUnseenCalls._M_h._M_bucket_count = 0;
  hasUnseenCalls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  hasUnseenCalls._M_h._M_element_count._0_4_ = 0x3f800000;
  hasUnseenCalls._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  hasUnseenCalls._M_h._M_rehash_policy._4_4_ = 0;
  hasUnseenCalls._M_h._M_rehash_policy._M_next_resize = 0;
  local_1d0 = (undefined1  [8])&expressionFuncs._M_h._M_rehash_policy._M_next_resize;
  expressionFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  expressionFuncs._M_h._M_bucket_count = 0;
  expressionFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  expressionFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  expressionFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  expressionFuncs._M_h._M_rehash_policy._4_4_ = 0;
  expressionFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  _Var28._M_nxt = *(_Hash_node_base **)(local_b0 + 0x10);
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_58 = this;
  if (_Var28._M_nxt != (_Hash_node_base *)0x0) {
    __k_00 = &callTargetsToLocalize._M_h._M_single_bucket;
    do {
      p_Var22 = _Var28._M_nxt[9]._M_nxt;
      local_60 = _Var28._M_nxt;
      if (p_Var22 != (_Hash_node_base *)0x0) {
        do {
          pvVar12 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                    std::
                    map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                                  *)&worthOptimizing._M_h._M_single_bucket,(key_type *)(p_Var22 + 1)
                                );
          std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>>
                    (pvVar12,*(undefined8 *)(pvVar12 + 8),p_Var22[3]._M_nxt,p_Var22[4]._M_nxt);
          p_Var1 = p_Var22[4]._M_nxt;
          for (p_Var25 = p_Var22[3]._M_nxt; p_Var25 != p_Var1; p_Var25 = p_Var25 + 1) {
            callTargetsToLocalize._M_h._M_single_bucket = p_Var25->_M_nxt;
            pmVar13 = std::__detail::
                      _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1d0,(key_type *)__k_00);
            uVar6 = *(undefined4 *)((long)&_Var28._M_nxt[1]._M_nxt + 4);
            uVar7 = *(undefined4 *)&_Var28._M_nxt[2]._M_nxt;
            uVar8 = *(undefined4 *)((long)&_Var28._M_nxt[2]._M_nxt + 4);
            *(undefined4 *)&(pmVar13->super_IString).str._M_len =
                 *(undefined4 *)&_Var28._M_nxt[1]._M_nxt;
            *(undefined4 *)((long)&(pmVar13->super_IString).str._M_len + 4) = uVar6;
            *(undefined4 *)&(pmVar13->super_IString).str._M_str = uVar7;
            *(undefined4 *)((long)&(pmVar13->super_IString).str._M_str + 4) = uVar8;
          }
          p_Var22 = p_Var22->_M_nxt;
        } while (p_Var22 != (_Hash_node_base *)0x0);
      }
      p_Var25 = local_60;
      for (p_Var22 = local_60[0x18]._M_nxt; p_Var22 != (_Hash_node_base *)0x0;
          p_Var22 = p_Var22->_M_nxt) {
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)&scanner.info;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)callTargetsToLocalize._M_h._M_single_bucket,p_Var22 + 1,__k_00);
      }
      for (p_Var22 = p_Var25[0x10]._M_nxt; p_Var25 = local_60, p_Var22 != (_Hash_node_base *)0x0;
          p_Var22 = p_Var22->_M_nxt) {
        p_Var25 = p_Var22[2]._M_nxt;
        pppEVar14 = std::__detail::
                    _Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_68,(key_type *)(p_Var22 + 1));
        *pppEVar14 = (mapped_type)p_Var25;
      }
      for (p_Var22 = local_60[0x1f]._M_nxt; p_Var22 != (_Hash_node_base *)0x0;
          p_Var22 = p_Var22->_M_nxt) {
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)local_170;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)callTargetsToLocalize._M_h._M_single_bucket,p_Var22 + 1,__k_00);
      }
      _Var28._M_nxt = p_Var25->_M_nxt;
    } while (_Var28._M_nxt != (_Hash_node_base *)0x0);
  }
  puVar29 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar29 != puVar2) {
    do {
      pEVar3 = (puVar29->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar3->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar24 = &pEVar3->value;
        }
        else {
          pvVar24 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)local_170;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_170,pvVar24,&callTargetsToLocalize._M_h._M_single_bucket);
      }
      puVar29 = puVar29 + 1;
    } while (puVar29 != puVar2);
  }
  hasUnseenCalls._M_h._M_single_bucket =
       (__node_base_ptr)&worthOptimizing._M_h._M_rehash_policy._M_next_resize;
  worthOptimizing._M_h._M_buckets = (__buckets_ptr)0x1;
  worthOptimizing._M_h._M_bucket_count = 0;
  worthOptimizing._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  worthOptimizing._M_h._M_element_count._0_4_ = 0x3f800000;
  worthOptimizing._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  worthOptimizing._M_h._M_rehash_policy._4_4_ = 0;
  worthOptimizing._M_h._M_rehash_policy._M_next_resize = 0;
  tailCallees._M_h._M_single_bucket =
       (__node_base_ptr)&callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize;
  callTargetsToLocalize._M_h._M_buckets = (__buckets_ptr)0x1;
  callTargetsToLocalize._M_h._M_bucket_count = 0;
  callTargetsToLocalize._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callTargetsToLocalize._M_h._M_element_count._0_4_ = 0x3f800000;
  callTargetsToLocalize._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  callTargetsToLocalize._M_h._M_rehash_policy._4_4_ = 0;
  callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize = 0;
  local_50._M_nxt = (_Hash_node_base *)local_b0;
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)&allCalls) {
    uVar27 = 0;
  }
  else {
    local_60 = (_Hash_node_base *)((ulong)local_60 & 0xffffffff00000000);
    p_Var18 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var30 = p_Var18 + 1;
      sVar15 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_170,(key_type *)p_Var30);
      if (sVar15 == 0) {
        local_68 = p_Var18;
        pFVar16 = Module::getFunction(module,(IString)*(IString *)(p_Var18 + 1));
        markStale.infoMap = (DAEFunctionInfoMap *)pFVar16;
        pmVar17 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_b0,(key_type *)p_Var30);
        calls = &local_68[1]._M_left;
        bVar11 = refineArgumentTypes(local_58,pFVar16,
                                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                                     module,pmVar17);
        if (bVar11) {
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)&hasUnseenCalls._M_h._M_single_bucket;
          std::
          _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                    ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)callTargetsToLocalize._M_h._M_single_bucket,&markStale,
                     &callTargetsToLocalize._M_h._M_single_bucket);
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)((markStale.infoMap)->_M_h)._M_buckets;
          optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((markStale.infoMap)->_M_h)._M_bucket_count;
          if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00838e7e;
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_50._M_nxt,
                                 (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
          pmVar17->stale = true;
        }
        bVar11 = refineReturnTypes(local_58,(Function *)markStale.infoMap,
                                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                                   module);
        if (bVar11) {
          callTargetsToLocalize._M_h._M_single_bucket =
               (__node_base_ptr)((markStale.infoMap)->_M_h)._M_buckets;
          optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((markStale.infoMap)->_M_h)._M_bucket_count;
          if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00838e7e;
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_50._M_nxt,
                                 (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
          pmVar17->stale = true;
          p_Var18 = local_68[1]._M_left;
          p_Var4 = local_68[1]._M_right;
          local_60 = (_Hash_node_base *)
                     CONCAT44(local_60._4_4_,(int)CONCAT71((int7)((ulong)local_68 >> 8),1));
          for (; p_Var18 != p_Var4; p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
            auStack_a8 = *(undefined1 (*) [8])p_Var18;
            pmVar13 = std::__detail::
                      _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_1d0,(key_type *)auStack_a8);
            callTargetsToLocalize._M_h._M_single_bucket =
                 (__node_base_ptr)(pmVar13->super_IString).str._M_len;
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(pmVar13->super_IString).str._M_str;
            if (optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00838e7e;
            pmVar17 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_50._M_nxt,
                                   (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
            pmVar17->stale = true;
          }
        }
        local_b8 = (Function *)markStale.infoMap;
        __l._M_len = 1;
        __l._M_array = &local_b8;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8,__l,
                   (allocator_type *)((long)&__range2 + 7));
        local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParamUtils::applyConstantValues
                  ((SortedVector *)&callTargetsToLocalize._M_h._M_single_bucket,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,&local_88,module);
        if ((Function *)
            local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start != (Function *)0x0) {
          operator_delete(local_88.
                          super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        p_Var23 = callTargetsToLocalize._M_h._M_single_bucket;
        if (auStack_a8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_a8,(long)name.super_IString.str._M_str - (long)auStack_a8)
          ;
          p_Var23 = callTargetsToLocalize._M_h._M_single_bucket;
        }
        for (; p_Var18 = local_68,
            p_Var23 !=
            (__node_base_ptr)
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
            p_Var23 = (__node_base_ptr)((long)&p_Var23->_M_nxt + 4)) {
          x = *(Index *)&p_Var23->_M_nxt;
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_b0,(key_type *)p_Var30);
          SortedVector::insert(&pmVar17->unusedParams,x);
        }
        if (callTargetsToLocalize._M_h._M_single_bucket !=
            (__node_base_ptr)
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          auStack_a8 = (undefined1  [8])((markStale.infoMap)->_M_h)._M_buckets;
          name.super_IString.str._M_len = ((markStale.infoMap)->_M_h)._M_bucket_count;
          if (name.super_IString.str._M_len == 0) goto LAB_00838e7e;
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_50._M_nxt,(key_type *)auStack_a8);
          pmVar17->stale = true;
        }
        if (callTargetsToLocalize._M_h._M_single_bucket != (__node_base_ptr)0x0) {
          operator_delete(callTargetsToLocalize._M_h._M_single_bucket,
                          (long)optimizedIndexes.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)callTargetsToLocalize._M_h._M_single_bucket);
        }
      }
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != (_Base_ptr)&allCalls);
    uVar27 = (uint)local_60;
  }
  if ((uVar27 & 1) != 0) {
    ReFinalize::ReFinalize((ReFinalize *)&callTargetsToLocalize._M_h._M_single_bucket);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&callTargetsToLocalize._M_h._M_single_bucket,(local_58->super_Pass).runner,module);
    callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)&PTR__ReFinalize_01090960;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_208);
    if (local_230 != (void *)0x0) {
      operator_delete(local_230,local_220 - (long)local_230);
    }
    Pass::~Pass((Pass *)&callTargetsToLocalize._M_h._M_single_bucket);
  }
  local_60 = (_Hash_node_base *)CONCAT44(local_60._4_4_,uVar27);
  if (allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&allCalls) {
    p_Var18 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      this_00 = &allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __k = p_Var18 + 1;
      sVar15 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_170,(key_type *)__k);
      if (sVar15 == 0) {
        markStale.infoMap =
             (DAEFunctionInfoMap *)Module::getFunction(module,(Name)*(string_view *)(p_Var18 + 1));
        sVar19 = Function::getNumParams((Function *)markStale.infoMap);
        if (sVar19 != 0) {
          local_b8 = (Function *)markStale.infoMap;
          __l_00._M_len = 1;
          __l_00._M_array = &local_b8;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8,
                     __l_00,(allocator_type *)((long)&__range2 + 7));
          pmVar17 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_b0,(key_type *)__k);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                     &(pmVar17->unusedParams).
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
          local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParamUtils::removeParameters
                    ((pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> *)
                     &callTargetsToLocalize._M_h._M_single_bucket,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8,
                     (SortedVector *)this_00,
                     (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&p_Var18[1]._M_left,
                     &local_88,module,(local_58->super_Pass).runner);
          if ((Function *)
              local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start != (Function *)0x0) {
            operator_delete(local_88.
                            super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            operator_delete((void *)allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            local_c0 - allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (auStack_a8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_a8,
                            (long)name.super_IString.str._M_str - (long)auStack_a8);
          }
          if (callTargetsToLocalize._M_h._M_single_bucket !=
              (__node_base_ptr)
              optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auStack_a8 = (undefined1  [8])&hasUnseenCalls._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                      ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)auStack_a8,&markStale,
                       (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8);
            auStack_a8 = (undefined1  [8])((markStale.infoMap)->_M_h)._M_buckets;
            name.super_IString.str._M_len = ((markStale.infoMap)->_M_h)._M_bucket_count;
            if (name.super_IString.str._M_len == 0) goto LAB_00838e7e;
            pmVar17 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_50._M_nxt,(key_type *)auStack_a8);
            pmVar17->stale = true;
            p_Var4 = p_Var18[1]._M_right;
            for (p_Var30 = p_Var18[1]._M_left; p_Var30 != p_Var4;
                p_Var30 = (_Base_ptr)&p_Var30->_M_parent) {
              local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start = *(pointer *)p_Var30;
              pmVar13 = std::__detail::
                        _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_1d0,(key_type *)&local_88);
              auStack_a8 = (undefined1  [8])(pmVar13->super_IString).str._M_len;
              name.super_IString.str._M_len = (size_t)(pmVar13->super_IString).str._M_str;
              if ((char *)name.super_IString.str._M_len == (char *)0x0) goto LAB_00838e7e;
              pmVar17 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_50._M_nxt,(key_type *)auStack_a8);
              pmVar17->stale = true;
            }
          }
          if ((int)optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage == 1) {
            auStack_a8 = (undefined1  [8])&tailCallees._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)auStack_a8,__k,
                       (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_a8);
          }
          if (callTargetsToLocalize._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            operator_delete(callTargetsToLocalize._M_h._M_single_bucket,
                            (long)optimizedIndexes.
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)callTargetsToLocalize._M_h._M_single_bucket);
          }
        }
      }
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != (_Rb_tree_node_base *)&allCalls);
  }
  pDVar31 = local_58;
  if (worthOptimizing._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    puVar26 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar26 != puVar5) {
      do {
        SVar32 = HeapType::getSignature
                           (&((puVar26->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
        if (SVar32.results.id.id != 0) {
          pFVar16 = (puVar26->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          auStack_a8 = *(undefined1 (*) [8])&(pFVar16->super_Importable).super_Named;
          name.super_IString.str._M_len =
               *(size_t *)((long)&(pFVar16->super_Importable).super_Named + 8);
          sVar15 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_170,(key_type *)auStack_a8);
          pDVar31 = local_58;
          if ((((sVar15 == 0) &&
               (pmVar17 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](local_b0,(key_type *)auStack_a8), pDVar31 = local_58,
               pmVar17->hasTailCalls == false)) &&
              (sVar15 = std::
                        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&scanner.info,(key_type *)auStack_a8), pDVar31 = local_58,
              sVar15 == 0)) &&
             ((iVar20 = std::
                        _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                        ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                                *)&worthOptimizing._M_h._M_single_bucket,(key_type *)auStack_a8),
              pDVar31 = local_58, iVar20._M_node != (_Base_ptr)&allCalls &&
              (p_Var18 = iVar20._M_node[1]._M_right,
              _Var21 = std::
                       __find_if<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,__gnu_cxx::__ops::_Iter_negate<wasm::DAE::iteration(wasm::Module*,std::unordered_map<wasm::Name,wasm::DAEFunctionInfo,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DAEFunctionInfo>>>&)::_lambda(wasm::Call*)_1_>>
                                 (iVar20._M_node[1]._M_left,p_Var18,local_58), pDVar31 = local_58,
              (_Base_ptr)_Var21._M_current == p_Var18)))) {
            bVar11 = removeReturnValue(local_58,(puVar26->_M_t).
                                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                                .super__Head_base<0UL,_wasm::Function_*,_false>.
                                                _M_head_impl,
                                       (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                                       &iVar20._M_node[1]._M_left,module);
            if (bVar11) {
              p_Var18 = iVar20._M_node[1]._M_left;
              local_68 = iVar20._M_node[1]._M_right;
              if (p_Var18 != local_68) {
                do {
                  markStale.infoMap = *(DAEFunctionInfoMap **)&p_Var18->_M_color;
                  pmVar13 = std::__detail::
                            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)local_1d0,(key_type *)&markStale);
                  local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)Module::getFunction(module,(Name)(pmVar13->super_IString).str);
                  callTargetsToLocalize._M_h._M_single_bucket =
                       (__node_base_ptr)&hasUnseenCalls._M_h._M_single_bucket;
                  std::
                  _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                            ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)callTargetsToLocalize._M_h._M_single_bucket,&local_88,
                             &callTargetsToLocalize._M_h._M_single_bucket);
                  p_Var18 = (_Base_ptr)&p_Var18->_M_parent;
                } while (p_Var18 != local_68);
              }
            }
            local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(puVar26->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            callTargetsToLocalize._M_h._M_single_bucket =
                 (__node_base_ptr)&hasUnseenCalls._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                      ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)callTargetsToLocalize._M_h._M_single_bucket,&local_88,
                       &callTargetsToLocalize._M_h._M_single_bucket);
            pFVar16 = (puVar26->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            callTargetsToLocalize._M_h._M_single_bucket =
                 *(__node_base_ptr *)&(pFVar16->super_Importable).super_Named;
            if (*(char **)((long)&(pFVar16->super_Importable).super_Named + 8) == (char *)0x0) {
LAB_00838e7e:
              __assert_fail("func.is()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                            ,0x123,
                            "auto wasm::DAE::iteration(Module *, DAEFunctionInfoMap &)::(anonymous class)::operator()(Name) const"
                           );
            }
            pmVar17 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_50._M_nxt,
                                   (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
            pmVar17->stale = true;
            p_Var30 = iVar20._M_node[1]._M_right;
            for (p_Var18 = iVar20._M_node[1]._M_left; pDVar31 = local_58, p_Var18 != p_Var30;
                p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
              local_88.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl
              .super__Vector_impl_data._M_start = *(pointer *)p_Var18;
              pmVar13 = std::__detail::
                        _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_1d0,(key_type *)&local_88);
              callTargetsToLocalize._M_h._M_single_bucket =
                   (__node_base_ptr)(pmVar13->super_IString).str._M_len;
              if ((pmVar13->super_IString).str._M_str == (char *)0x0) goto LAB_00838e7e;
              pmVar17 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_50._M_nxt,
                                     (key_type *)&callTargetsToLocalize._M_h._M_single_bucket);
              pmVar17->stale = true;
            }
          }
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar5);
    }
  }
  p_Var22 = local_60;
  if (callTargetsToLocalize._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    expressionFuncs._M_h._M_single_bucket = &local_50;
    ParamUtils::localizeCallsTo
              ((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&tailCallees._M_h._M_single_bucket,module,(pDVar31->super_Pass).runner,
               (function<void_(wasm::Function_*)> *)&expressionFuncs._M_h._M_single_bucket);
    __dest = &expressionFuncs._M_h._M_single_bucket;
    std::
    _Function_handler<void_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp:406:58)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  }
  if ((pDVar31->optimize == true) &&
     (worthOptimizing._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
    OptUtils::optimizeAfterInlining
              ((FuncSet *)&hasUnseenCalls._M_h._M_single_bucket,module,(pDVar31->super_Pass).runner)
    ;
  }
  _Var10._M_nxt = worthOptimizing._M_h._M_before_begin._M_nxt;
  _Var9._M_nxt = callTargetsToLocalize._M_h._M_before_begin._M_nxt;
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&tailCallees._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&hasUnseenCalls._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Name>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1d0);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_170);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&scanner.info);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               *)&worthOptimizing._M_h._M_single_bucket);
  if (scanner.
      super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
      super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
      super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9]
      .currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                    .super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                    super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.
                    fixed._M_elems[9].currp,
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                          .
                          super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>
                          .super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                          stack.fixed._M_elems[9].currp);
  }
  Pass::~Pass((Pass *)local_4e8);
  return (bool)(_Var9._M_nxt != (_Hash_node_base *)0x0 |
               _Var10._M_nxt != (_Hash_node_base *)0x0 | (byte)p_Var22 & 1);
}

Assistant:

bool iteration(Module* module, DAEFunctionInfoMap& infoMap) {
    allDroppedCalls.clear();

#if DAE_DEBUG
    // Enable this path to mark all contents as stale at the start of each
    // iteration, which can be used to check for staleness bugs (that is, bugs
    // where something should have been marked stale, but wasn't). Note, though,
    // that staleness bugs can easily cause serious issues with validation (e.g.
    // if data is stale we may miss that there is an additional caller, that
    // prevents refining argument types etc.), so this may not be terribly
    // helpful.
    if (getenv("ALWAYS_MARK_STALE")) {
      for (auto& [_, info] : infoMap) {
        info.markStale();
      }
    }
#endif

    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    struct CallContext {
      Call* call;
      Function* func;
    };
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    std::unordered_set<Name> hasUnseenCalls;
    // Track the function in which relevant expressions exist. When we modify
    // those expressions we will need to mark the function's info as stale.
    std::unordered_map<Expression*, Name> expressionFuncs;
    for (auto& [func, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
        for (auto* call : calls) {
          expressionFuncs[call] = func;
        }
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [call, dropp] : info.droppedCalls) {
        allDroppedCalls[call] = dropp;
      }
      for (auto& name : info.hasUnseenCalls) {
        hasUnseenCalls.insert(name);
      }
    }
    // Exports are considered unseen calls.
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        hasUnseenCalls.insert(*curr->getInternalName());
      }
    }

    // Track which functions we changed that are worth re-optimizing at the end.
    std::unordered_set<Function*> worthOptimizing;

    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;

    // If we find that localizing call arguments can help (by moving their
    // effects outside, so ParamUtils::removeParameters can handle them), then
    // we do that at the end and perform another cycle. It is simpler to just do
    // another cycle than to track the locations of calls, which is tricky as
    // localization might move a call (if a call happens to be another call's
    // param). In practice it is rare to find call arguments we want to remove,
    // and even more rare to find effects get in the way, so this should not
    // cause much overhead.
    //
    // This set tracks the functions for whom calls to it should be modified.
    std::unordered_set<Name> callTargetsToLocalize;

    // As we optimize, we mark things as stale.
    auto markStale = [&](Name func) {
      // We only ever mark functions stale (not the global scope, which we never
      // modify). An attempt to modify the global scope, identified by a null
      // function name, is a logic bug.
      assert(func.is());
      infoMap[func].markStale();
    };
    auto markCallersStale = [&](const std::vector<Call*>& calls) {
      for (auto* call : calls) {
        markStale(expressionFuncs[call]);
      }
    };

    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      if (refineArgumentTypes(func, calls, module, infoMap[name])) {
        worthOptimizing.insert(func);
        markStale(func->name);
      }
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
        markStale(func->name);
        markCallersStale(calls);
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
      if (!optimizedIndexes.empty()) {
        markStale(func->name);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (hasUnseenCalls.count(name)) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto [removedIndexes, outcome] = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        worthOptimizing.insert(func);
        markStale(func->name);
        markCallersStale(calls);
      }
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        callTargetsToLocalize.insert(name);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (worthOptimizing.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (hasUnseenCalls.count(name)) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        if (removeReturnValue(func.get(), calls, module)) {
          // We should optimize the callers.
          for (auto* call : calls) {
            worthOptimizing.insert(module->getFunction(expressionFuncs[call]));
          }
        }
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        worthOptimizing.insert(func.get());
        markStale(func->name);
        markCallersStale(calls);
      }
    }
    if (!callTargetsToLocalize.empty()) {
      ParamUtils::localizeCallsTo(
        callTargetsToLocalize, *module, getPassRunner(), [&](Function* func) {
          markStale(func->name);
        });
    }
    if (optimize && !worthOptimizing.empty()) {
      OptUtils::optimizeAfterInlining(worthOptimizing, module, getPassRunner());
    }

    return !worthOptimizing.empty() || refinedReturnTypes ||
           !callTargetsToLocalize.empty();
  }